

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

periodic_task_handle_conflict
libcmselect_LTX_add_periodic
          (CMtrans_services svc,select_data_ptr *sdp,int interval_sec,int interval_usec,
          select_list_func func,void *arg1,void *arg2)

{
  int iVar1;
  transport_entry_conflict p_Var2;
  int in_ECX;
  int in_EDX;
  CManager_conflict in_RSI;
  select_data_ptr *in_RDI;
  WritePossibleCallback in_R8;
  CMTransport_func in_R9;
  periodic_task_handle_conflict handle;
  select_data_ptr sd;
  transport_entry_conflict *size;
  
  size = in_RSI->transports;
  p_Var2 = (transport_entry_conflict)select_malloc((size_t)size);
  if (size == (transport_entry_conflict *)0x0) {
    init_select_data((CMtrans_services)handle,in_RDI,in_RSI);
    size = in_RSI->transports;
  }
  if ((size[8] != (transport_entry_conflict)0x0) &&
     (iVar1 = (*(code *)in_RDI[0x17])
                        (size[8],
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
                         ,0x28d), iVar1 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
           ,0x28d,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  *(int *)&p_Var2->trans_name = in_EDX;
  *(int *)((long)&p_Var2->trans_name + 4) = in_ECX;
  p_Var2->cm = (CManager)0xffffffffffffffff;
  gettimeofday((timeval *)&p_Var2->dlhandle,(__timezone_ptr_t)0x0);
  increment_time((timeval *)&p_Var2->dlhandle,in_EDX,in_ECX);
  p_Var2->write_possible = in_R8;
  p_Var2->transport_init = in_R9;
  p_Var2->listen = (CMTransport_listen_func)sd;
  p_Var2->initiate_conn = (CMTransport_conn_func)0x0;
  if (size[6] == (transport_entry_conflict)0x0) {
    size[6] = p_Var2;
  }
  else {
    p_Var2->initiate_conn = (CMTransport_conn_func)size[6];
    size[6] = p_Var2;
  }
  wake_server_thread((select_data_ptr)0x101e33);
  return (periodic_task_handle_conflict)p_Var2;
}

Assistant:

extern periodic_task_handle
libcmselect_LTX_add_periodic(CMtrans_services svc, select_data_ptr *sdp, int interval_sec, int interval_usec, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    periodic_task_handle handle = malloc(sizeof(struct _periodic_task));
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    handle->period_sec = interval_sec;
    handle->period_usec = interval_usec;
    handle->executing = (thr_thread_id) -1;
#ifndef HAVE_WINDOWS_H
    gettimeofday(&handle->next_time, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
    {
	struct _timeb nowb;
	_ftime(&nowb);
	handle->next_time.tv_sec = (long)nowb.time;
	handle->next_time.tv_usec = nowb.millitm * 1000;
    }
#endif
    increment_time(&handle->next_time, interval_sec, interval_usec);
    handle->func = func;
    handle->arg1 = arg1;
    handle->arg2 = arg2;
    handle->next = NULL;

    if (sd->periodic_task_list == NULL) {
	sd->periodic_task_list = handle;
    } else {
	handle->next = sd->periodic_task_list;
	sd->periodic_task_list = handle;
    }
    wake_server_thread(sd);
    return handle;
}